

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_pattern(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  xmlChar *pxVar7;
  int nr;
  bool bVar8;
  int test_ret;
  xmlNodePtr in_RSI;
  xmlNodePtr pxVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int test_ret_1;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing pattern : 10 of 15 functions ...");
  }
  bVar8 = true;
  iVar3 = 0;
  while (bVar8) {
    iVar1 = xmlMemBlocks();
    xmlPatternFromRoot(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar8 = false;
    printf("Leak of %d blocks found in xmlPatternFromRoot");
    iVar3 = iVar3 + 1;
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  bVar8 = true;
  iVar1 = 0;
  while (bVar8) {
    pxVar9 = (xmlNodePtr)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar6 = (int)pxVar9;
      if (iVar6 == 3) break;
      iVar4 = xmlMemBlocks();
      in_RSI = gen_xmlNodePtr(iVar6,iVar2);
      xmlPatternMatch(0,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar6,in_RSI,nr);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar4 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlPatternMatch",(ulong)(uint)(iVar2 - iVar4));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar9;
      }
      pxVar9 = (xmlNodePtr)(ulong)(iVar6 + 1);
    }
    bVar8 = false;
  }
  function_tests = function_tests + 1;
  iVar3 = iVar3 + iVar1;
  bVar8 = true;
  while (bVar8) {
    iVar1 = xmlMemBlocks();
    xmlPatternMaxDepth(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar8 = false;
    printf("Leak of %d blocks found in xmlPatternMaxDepth");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + 1;
  }
  function_tests = function_tests + 1;
  bVar8 = true;
  while (bVar8) {
    iVar1 = xmlMemBlocks();
    xmlPatternMinDepth(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar8 = false;
    printf("Leak of %d blocks found in xmlPatternMinDepth");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + 1;
  }
  function_tests = function_tests + 1;
  bVar8 = true;
  while (bVar8) {
    iVar1 = xmlMemBlocks();
    xmlPatternStreamable(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar8 = false;
    printf("Leak of %d blocks found in xmlPatternStreamable");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + 1;
  }
  function_tests = function_tests + 1;
  bVar8 = true;
  while (bVar8) {
    iVar1 = xmlMemBlocks();
    xmlStreamPop(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar8 = false;
    printf("Leak of %d blocks found in xmlStreamPop");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + 1;
  }
  function_tests = function_tests + 1;
  pxVar9 = (xmlNodePtr)0x1;
  local_38 = 0;
  while (pxVar9 != (xmlNodePtr)0x0) {
    uVar10 = 0;
    while( true ) {
      pxVar9 = (xmlNodePtr)0x0;
      iVar1 = (int)uVar10;
      if (iVar1 == 5) break;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar6 = (int)pxVar9;
        if (iVar6 == 5) break;
        iVar4 = xmlMemBlocks();
        in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar1,iVar2);
        pxVar7 = gen_const_xmlChar_ptr(iVar6,iVar2);
        xmlStreamPush(0,in_RSI,pxVar7);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar4 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStreamPush",(ulong)(uint)(iVar2 - iVar4));
          local_38 = local_38 + 1;
          printf(" %d",0);
          printf(" %d",uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar9;
        }
        pxVar9 = (xmlNodePtr)(ulong)(iVar6 + 1);
      }
      uVar10 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  pxVar9 = (xmlNodePtr)0x1;
  test_ret_1 = 0;
  while (pxVar9 != (xmlNodePtr)0x0) {
    uVar10 = 0;
    while( true ) {
      pxVar9 = (xmlNodePtr)0x0;
      iVar1 = (int)uVar10;
      if (iVar1 == 5) break;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar6 = (int)pxVar9;
        if (iVar6 == 5) break;
        iVar4 = xmlMemBlocks();
        in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar1,iVar2);
        pxVar7 = gen_const_xmlChar_ptr(iVar6,iVar2);
        xmlStreamPushAttr(0,in_RSI,pxVar7);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar4 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStreamPushAttr",(ulong)(uint)(iVar2 - iVar4));
          test_ret_1 = test_ret_1 + 1;
          printf(" %d",0);
          printf(" %d",uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar9;
        }
        pxVar9 = (xmlNodePtr)(ulong)(iVar6 + 1);
      }
      uVar10 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar10 = 1;
  local_34 = 0;
  while (uVar10 != 0) {
    uVar12 = 0;
    while( true ) {
      uVar10 = 0;
      iVar1 = (int)uVar12;
      if (iVar1 == 5) break;
      while (iVar2 = (int)uVar10, iVar2 != 5) {
        pxVar9 = (xmlNodePtr)0x0;
        while( true ) {
          iVar6 = (int)in_RSI;
          iVar4 = (int)pxVar9;
          if (iVar4 == 4) break;
          iVar5 = xmlMemBlocks();
          in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar1,iVar6);
          pxVar7 = gen_const_xmlChar_ptr(iVar2,iVar6);
          iVar6 = gen_int(iVar4,iVar6);
          xmlStreamPushNode(0,in_RSI,pxVar7,iVar6);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStreamPushNode",(ulong)(uint)(iVar6 - iVar5));
            local_34 = local_34 + 1;
            printf(" %d",0);
            printf(" %d",uVar12);
            printf(" %d",uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar9;
          }
          pxVar9 = (xmlNodePtr)(ulong)(iVar4 + 1);
        }
        uVar10 = (ulong)(iVar2 + 1);
      }
      uVar12 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar11 = local_34 + iVar3 + local_38 + test_ret_1;
  bVar8 = true;
  while (bVar8) {
    iVar3 = xmlMemBlocks();
    xmlStreamWantsAnyNode(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    iVar1 = xmlMemBlocks();
    bVar8 = false;
    printf("Leak of %d blocks found in xmlStreamWantsAnyNode",(ulong)(uint)(iVar1 - iVar3));
    printf(" %d",0);
    putchar(10);
    uVar11 = uVar11 + 1;
  }
  function_tests = function_tests + 1;
  if (uVar11 != 0) {
    printf("Module pattern: %d errors\n",(ulong)uVar11);
  }
  return uVar11;
}

Assistant:

static int
test_pattern(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing pattern : 10 of 15 functions ...\n");
    test_ret += test_xmlPatternFromRoot();
    test_ret += test_xmlPatternGetStreamCtxt();
    test_ret += test_xmlPatternMatch();
    test_ret += test_xmlPatternMaxDepth();
    test_ret += test_xmlPatternMinDepth();
    test_ret += test_xmlPatternStreamable();
    test_ret += test_xmlPatterncompile();
    test_ret += test_xmlStreamPop();
    test_ret += test_xmlStreamPush();
    test_ret += test_xmlStreamPushAttr();
    test_ret += test_xmlStreamPushNode();
    test_ret += test_xmlStreamWantsAnyNode();

    if (test_ret != 0)
	printf("Module pattern: %d errors\n", test_ret);
    return(test_ret);
}